

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

bool __thiscall MinVR::element::add_attribute(element *this,attribute *ptr_attribute)

{
  iterator iVar1;
  value_type *in_RSI;
  list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_> *in_RDI;
  
  if (in_RSI != (value_type *)0x0) {
    std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::push_back
              (in_RDI,in_RSI);
    iVar1 = std::__cxx11::list<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>::begin
                      (in_RDI);
    in_RDI[1].super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl.
    _M_node.super__List_node_base._M_prev = iVar1._M_node;
    *(undefined1 *)
     &in_RDI[5].super__List_base<MinVR::attribute_*,_std::allocator<MinVR::attribute_*>_>._M_impl.
      _M_node.super__List_node_base._M_next = 0;
  }
  return in_RSI != (value_type *)0x0;
}

Assistant:

bool element::add_attribute(attribute* ptr_attribute)
{
    if(ptr_attribute == NULL)
        return false;
    m_attribute_list.push_back(ptr_attribute);
    m_attribute_iterator = m_attribute_list.begin();
    is_empty_attribute_list = false;
    return true;
}